

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O0

void __thiscall CDT::test(CDT *this,ostream *out,DataSet *dataset)

{
  int iVar1;
  reference pvVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  reference pvVar4;
  ostream *poVar5;
  double __x;
  double dVar6;
  Shape SVar7;
  double local_70;
  double output;
  undefined1 local_60 [4];
  uint i;
  vector<Matrix<double>,_std::allocator<Matrix<double>_>_> matrices;
  uint right_guesses;
  uint local_30;
  uint all_guesses;
  DataSet *dataset_local;
  ostream *out_local;
  CDT *this_local;
  
  SVar7 = DataSet::shape(dataset);
  local_30 = SVar7.n_row;
  matrices.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  DataSet::compile((vector<Matrix<double>,_std::allocator<Matrix<double>_>_> *)local_60,dataset,1);
  for (output._4_4_ = 0; output._4_4_ < local_30; output._4_4_ = output._4_4_ + 1) {
    pvVar2 = std::vector<Matrix<double>,_std::allocator<Matrix<double>_>_>::operator[]
                       ((vector<Matrix<double>,_std::allocator<Matrix<double>_>_> *)local_60,0);
    pvVar3 = Matrix<double>::operator[](pvVar2,output._4_4_);
    __x = predict(this,pvVar3);
    dVar6 = ceil(__x);
    if (0.5 <= dVar6 - __x) {
      local_70 = floor(__x);
    }
    else {
      local_70 = ceil(__x);
    }
    pvVar2 = std::vector<Matrix<double>,_std::allocator<Matrix<double>_>_>::operator[]
                       ((vector<Matrix<double>,_std::allocator<Matrix<double>_>_> *)local_60,1);
    pvVar3 = Matrix<double>::operator[](pvVar2,output._4_4_);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,0);
    iVar1 = (int)(local_70 - *pvVar4);
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    if ((double)iVar1 < 1e-05) {
      matrices.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           matrices.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    }
  }
  poVar5 = std::operator<<(out,"Accuracy: ");
  poVar5 = (ostream *)
           std::ostream::operator<<
                     (poVar5,(double)matrices.
                                     super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ /
                             (double)local_30);
  std::operator<<(poVar5,'\n');
  std::vector<Matrix<double>,_std::allocator<Matrix<double>_>_>::~vector
            ((vector<Matrix<double>,_std::allocator<Matrix<double>_>_> *)local_60);
  return;
}

Assistant:

void CDT::test(std::ostream& out, const DataSet& dataset) const{
    unsigned all_guesses=dataset.shape().n_row;
    unsigned right_guesses=0;

    std::vector<Matrix_d> matrices=dataset.compile();
    for(unsigned i=0;i<all_guesses;++i){
        double output=predict(matrices[0][i]);
        // std::cout<<" : "<<output<<" vs "<<matrices[1][i][0]<<'\n';
        if(ceil(output)-output<0.5) output=ceil(output);
        else output=floor(output);
        if(abs(output-matrices[1][i][0])<0.00001){
            // std::cout<<"+\n";
            ++right_guesses;
        }
    }

    out<<"Accuracy: "<<(double)right_guesses/all_guesses<<'\n';
}